

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_vp8e_vepu2_v2.c
# Opt level: O0

MPP_RET hal_vp8e_vepu2_wait_v2(void *hal,HalEncTask *task)

{
  RK_U32 RVar1;
  long lVar2;
  RK_S32 sw_length;
  Vp8eVepu2Reg_t *regs;
  Vp8eFeedback *fb;
  HalVp8eCtx *ctx;
  MPP_RET ret;
  HalEncTask *task_local;
  void *hal_local;
  
  lVar2 = *(long *)((long)hal + 0x58);
  RVar1 = task->length;
  if (*(long *)((long)hal + 0x50) == 0) {
    _mpp_log_l(2,"hal_vp8e_vepu2_v2","invalid dev ctx\n","hal_vp8e_vepu2_wait_v2");
    hal_local._4_4_ = MPP_NOK;
  }
  else {
    hal_local._4_4_ = mpp_dev_ioctl(*(MppDev *)((long)hal + 0x50),0x10,(void *)0x0);
    if (hal_local._4_4_ != MPP_OK) {
      _mpp_log_l(2,"hal_vp8e_vepu2_v2","poll cmd failed %d\n","hal_vp8e_vepu2_wait_v2",
                 (ulong)(uint)hal_local._4_4_);
    }
    *(uint *)((long)hal + 8) = *(uint *)(lVar2 + 0x1b4) & 0x250;
    if ((*(uint *)(lVar2 + 0x1b4) & 2) == 0) {
      if ((*(uint *)(lVar2 + 0x1b4) & 0x20) != 0) {
        *(undefined4 *)((long)hal + 0x3830) = 0;
      }
    }
    else {
      vp8e_update_hw_cfg(hal);
    }
    hal_vp8e_update_buffers(hal,task);
    *(uint *)((long)hal + 0x6920) = (uint)((task->rc_task->frm).val >> 4) & 1;
    *(long *)((long)hal + 0x6918) = *(long *)((long)hal + 0x6918) + 1;
    (task->rc_task->info).bit_real = *(int *)((long)hal + 0x690c) << 3;
    task->hw_length = task->length - RVar1;
  }
  return hal_local._4_4_;
}

Assistant:

static MPP_RET hal_vp8e_vepu2_wait_v2(void *hal, HalEncTask *task)
{
    MPP_RET ret = MPP_OK;
    HalVp8eCtx *ctx = (HalVp8eCtx *)hal;

    Vp8eFeedback *fb = &ctx->feedback;
    Vp8eVepu2Reg_t *regs = (Vp8eVepu2Reg_t *) ctx->regs;
    RK_S32 sw_length = task->length;

    if (NULL == ctx->dev) {
        mpp_err_f("invalid dev ctx\n");
        return MPP_NOK;
    }

    ret = mpp_dev_ioctl(ctx->dev, MPP_DEV_CMD_POLL, NULL);
    if (ret)
        mpp_err_f("poll cmd failed %d\n", ret);

    fb->hw_status = regs->sw109.val & HW_STATUS_MASK;
    if (regs->sw109.val & HW_STATUS_FRAME_READY)
        vp8e_update_hw_cfg(ctx);
    else if (regs->sw109.val & HW_STATUS_BUFFER_FULL)
        ctx->bitbuf[1].size = 0;

    hal_vp8e_update_buffers(ctx, task);

    ctx->last_frm_intra = task->rc_task->frm.is_intra;
    ctx->frame_cnt++;

    task->rc_task->info.bit_real = ctx->frame_size << 3;
    task->hw_length = task->length - sw_length;
    return ret;
}